

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidgetPrivate::createRecursively(QWidgetPrivate *this)

{
  long lVar1;
  QWidgetPrivate *this_00;
  int i;
  ulong uVar2;
  
  QWidget::create(*(QWidget **)&this->field_0x8,0,false,false);
  for (uVar2 = 0; uVar2 < *(ulong *)&this->field_0x28; uVar2 = uVar2 + 1) {
    lVar1 = *(long *)(*(long *)&this->field_0x20 + uVar2 * 8);
    if ((((lVar1 != 0) &&
         (this_00 = *(QWidgetPrivate **)(lVar1 + 8), (this_00->field_0x30 & 1) != 0)) &&
        ((*(byte *)(*(long *)(lVar1 + 0x20) + 10) & 1) == 0)) &&
       (((*(byte *)(*(long *)(lVar1 + 0x20) + 0xc) & 1) == 0 &&
        ((this_00->high_attributes[0] & 0x10000000) == 0)))) {
      createRecursively(this_00);
    }
  }
  return;
}

Assistant:

void QWidgetPrivate::createRecursively()
{
    Q_Q(QWidget);
    q->create(0, true, true);
    for (int i = 0; i < children.size(); ++i) {
        QWidget *child = qobject_cast<QWidget *>(children.at(i));
        if (child && !child->isHidden() && !child->isWindow() && !child->testAttribute(Qt::WA_WState_Created))
            child->d_func()->createRecursively();
    }
}